

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBScene.h
# Opt level: O2

void __thiscall Assimp::COB::Node::Node(Node *this,Type type)

{
  (this->super_ChunkInfo).id = 0;
  (this->super_ChunkInfo).parent_id = 0;
  (this->super_ChunkInfo).version = 0;
  (this->super_ChunkInfo).size = 0xffffffff;
  this->_vptr_Node = (_func_int **)&PTR__Node_0071f960;
  this->type = type;
  std::_Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>::
  _Deque_base(&(this->temp_children).
               super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
             );
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->transform).a1 = 1.0;
  (this->transform).a2 = 0.0;
  (this->transform).a3 = 0.0;
  (this->transform).a4 = 0.0;
  (this->transform).b1 = 0.0;
  (this->transform).b2 = 1.0;
  (this->transform).b3 = 0.0;
  (this->transform).b4 = 0.0;
  (this->transform).c1 = 0.0;
  (this->transform).c2 = 0.0;
  (this->transform).c3 = 1.0;
  (this->transform).c4 = 0.0;
  (this->transform).d1 = 0.0;
  (this->transform).d2 = 0.0;
  (this->transform).d3 = 0.0;
  *(undefined8 *)&(this->transform).d4 = 0x3f8000003f800000;
  return;
}

Assistant:

Node(Type type) : type(type), unit_scale(1.f){}